

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_GetExtPrivkeyInformation_Test::TestBody
          (DescriptorKeyInfo_GetExtPrivkeyInformation_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_238;
  Message local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_1;
  Message local_210;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  Message local_1c0;
  allocator local_1b1;
  string local_1b0;
  string local_190;
  string local_170 [8];
  string key_str;
  undefined1 local_130 [8];
  string ext_path_str;
  string local_108 [8];
  string ext_str;
  undefined1 local_e0 [8];
  string path;
  ExtPrivkey privkey;
  allocator local_31;
  undefined1 local_30 [8];
  string extkey;
  DescriptorKeyInfo_GetExtPrivkeyInformation_Test *this_local;
  
  extkey.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "tprv8fFXTTUs3e5Q1CGAPnabXXFUJor2q2jXo3VCceUggUNGMgCQ4FsLgPemcq2FPym15qZ2kjNx414T3Ypha1gAL3GHUH3uN3xDB3ymD434uWh"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)((long)&path.field_2 + 8),(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_e0,"0\'/1",(allocator *)(ext_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(ext_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,"[f4a831a2]",(allocator *)(ext_path_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(ext_path_str.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key_str.field_2 + 8),"[f4a831a2/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key_str.field_2 + 8),"]");
  std::__cxx11::string::~string((string *)(key_str.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_170);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"",&local_1b1);
      cfd::core::DescriptorKeyInfo::GetExtPrivkeyInformation
                (&local_190,(ExtPrivkey *)((long)&path.field_2 + 8),&local_1b0);
      std::__cxx11::string::operator=(local_170,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    }
  }
  else {
    testing::Message::Message(&local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x5e0,
               "Expected: key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, \"\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_1c0);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1d8,"key_str.c_str()","ext_str.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x5e1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::GetExtPrivkeyInformation
                (&local_208,(ExtPrivkey *)((long)&path.field_2 + 8),(string *)local_e0);
      std::__cxx11::string::operator=(local_170,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
    }
  }
  else {
    testing::Message::Message(&local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x5e3,
               "Expected: key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, path) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_210);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_228,"key_str.c_str()","ext_path_str.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x5e4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string((string *)local_e0);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)((long)&path.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, GetExtPrivkeyInformation) {
  std::string extkey = "tprv8fFXTTUs3e5Q1CGAPnabXXFUJor2q2jXo3VCceUggUNGMgCQ4FsLgPemcq2FPym15qZ2kjNx414T3Ypha1gAL3GHUH3uN3xDB3ymD434uWh";
  ExtPrivkey privkey(extkey);
  std::string path = "0'/1";
  std::string ext_str = "[f4a831a2]";
  std::string ext_path_str = "[f4a831a2/" + path + "]";
  std::string key_str;

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, ""));
  EXPECT_STREQ(key_str.c_str(), ext_str.c_str());

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, path));
  EXPECT_STREQ(key_str.c_str(), ext_path_str.c_str());
}